

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::RBCOMVisitor::RBCOMVisitor(RBCOMVisitor *this,SimInfo *info)

{
  SimInfo *in_RDI;
  BaseRigidBodyVisitor *in_stack_ffffffffffffffe0;
  
  BaseRigidBodyVisitor::BaseRigidBodyVisitor(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__RBCOMVisitor_00486598;
  std::__cxx11::string::operator=((string *)&in_RDI->forceField_,"RBCOMVisitor");
  return;
}

Assistant:

RBCOMVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "RBCOMVisitor";
    }